

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  string file;
  NanoDebugger debugger;
  string local_100;
  string local_e0 [32];
  NanoDebugger local_c0;
  
  if (argc < 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Usage NanoDebugger.exe [FILE]");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::string::string<std::allocator<char>>(local_e0,argv[1],(allocator<char> *)&local_c0);
  std::__cxx11::string::string((string *)&local_100,local_e0);
  NanoDebugger::NanoDebugger(&local_c0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  NanoDebugger::debug(&local_c0);
  NanoDebugger::~NanoDebugger(&local_c0);
  std::__cxx11::string::~string(local_e0);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc < 1) {
		std::cout << "Usage NanoDebugger.exe [FILE]" << std::endl;
	}
	std::string file = (argv[1]);
	NanoDebugger debugger(file);
	debugger.debug();
	return 0;
}